

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

QSize __thiscall QGridLayout::sizeHint(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  int hSpacing;
  int vSpacing;
  QGridLayoutPrivate *pQVar1;
  QSize QVar2;
  QSize QVar3;
  QGridLayoutPrivate *d;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = this_00->horizontalSpacing;
  pQVar1 = this_00;
  if (hSpacing < 0) {
    hSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutHorizontalSpacing);
    pQVar1 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  }
  vSpacing = pQVar1->verticalSpacing;
  if (vSpacing < 0) {
    vSpacing = qSmartSpacing(&this->super_QLayout,PM_LayoutVerticalSpacing);
  }
  QVar2 = QGridLayoutPrivate::findSize(this_00,4,hSpacing,vSpacing);
  QVar3.ht.m_i = QVar2.ht.m_i.m_i + this_00->topMargin + this_00->bottomMargin;
  QVar3.wd.m_i = this_00->rightMargin + QVar2.wd.m_i.m_i + this_00->leftMargin;
  return QVar3;
}

Assistant:

QSize QGridLayout::sizeHint() const
{
    Q_D(const QGridLayout);
    QSize result(d->sizeHint(horizontalSpacing(), verticalSpacing()));
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    result += QSize(left + right, top + bottom);
    return result;
}